

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::calculateJacobi
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btConstraintInfo2 *info,int srow,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  btScalar *pbVar1;
  btTransform *in_RCX;
  btTransform *in_RDX;
  long in_RDI;
  long in_R8;
  int in_R9D;
  btVector3 bVar2;
  btVector3 *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int i;
  btVector3 relB;
  btVector3 relA;
  btVector3 tmpB;
  btVector3 tmpA;
  btScalar *J2;
  btScalar *J1;
  btVector3 *this_00;
  btVector3 *this_01;
  long local_e8;
  long local_e0;
  int local_cc;
  btScalar local_c8 [2];
  btScalar local_c0 [2];
  btScalar local_b8 [2];
  btScalar abStack_b0 [2];
  btScalar local_a8 [2];
  btScalar abStack_a0 [2];
  btScalar local_98 [2];
  btScalar abStack_90 [2];
  btVector3 local_88;
  btVector3 local_78;
  btVector3 local_68;
  btVector3 local_58;
  long local_40;
  long local_38;
  int local_2c;
  long local_28;
  btTransform *local_20;
  btTransform *local_18;
  
  if (in_stack_00000010 == 0) {
    local_e0 = *(long *)(in_R8 + 8);
  }
  else {
    local_e0 = *(long *)(in_R8 + 0x10);
  }
  local_38 = local_e0;
  if (in_stack_00000010 == 0) {
    local_e8 = *(long *)(in_R8 + 0x18);
  }
  else {
    local_e8 = *(long *)(in_R8 + 0x20);
  }
  local_40 = local_e8;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  pbVar1 = btVector3::operator_cast_to_float_(in_stack_00000008);
  *(btScalar *)(local_38 + (long)local_2c * 4) = *pbVar1;
  pbVar1 = btVector3::operator_cast_to_float_(in_stack_00000008);
  *(btScalar *)(local_38 + (long)(local_2c + 1) * 4) = pbVar1[1];
  pbVar1 = btVector3::operator_cast_to_float_(in_stack_00000008);
  *(btScalar *)(local_38 + (long)(local_2c + 2) * 4) = pbVar1[2];
  pbVar1 = btVector3::operator_cast_to_float_(in_stack_00000008);
  *(float *)(local_40 + (long)local_2c * 4) = -*pbVar1;
  pbVar1 = btVector3::operator_cast_to_float_(in_stack_00000008);
  *(float *)(local_40 + (long)(local_2c + 1) * 4) = -pbVar1[1];
  pbVar1 = btVector3::operator_cast_to_float_(in_stack_00000008);
  *(float *)(local_40 + (long)(local_2c + 2) * 4) = -pbVar1[2];
  if (in_stack_00000010 == 0) {
    btVector3::btVector3(&local_58);
    btVector3::btVector3(&local_68);
    this_00 = &local_78;
    btVector3::btVector3(this_00);
    this_01 = &local_88;
    btVector3::btVector3(this_01);
    btTransform::getOrigin((btTransform *)(in_RDI + 0x52c));
    btTransform::getOrigin(local_20);
    bVar2 = operator-(this_01,this_00);
    local_98 = bVar2.m_floats._0_8_;
    abStack_90 = bVar2.m_floats._8_8_;
    local_88.m_floats[0] = local_98[0];
    local_88.m_floats[1] = local_98[1];
    local_88.m_floats[2] = abStack_90[0];
    local_88.m_floats[3] = abStack_90[1];
    btTransform::getOrigin((btTransform *)(in_RDI + 0x4ec));
    btTransform::getOrigin(local_18);
    bVar2 = operator-(this_01,this_00);
    local_a8 = bVar2.m_floats._0_8_;
    abStack_a0 = bVar2.m_floats._8_8_;
    local_78.m_floats[0] = local_a8[0];
    local_78.m_floats[1] = local_a8[1];
    local_78.m_floats[2] = abStack_a0[0];
    local_78.m_floats[3] = abStack_a0[1];
    bVar2 = btVector3::cross(this_01,this_00);
    local_b8 = bVar2.m_floats._0_8_;
    abStack_b0 = bVar2.m_floats._8_8_;
    local_58.m_floats[0] = local_b8[0];
    local_58.m_floats[1] = local_b8[1];
    local_58.m_floats[2] = abStack_b0[0];
    local_58.m_floats[3] = abStack_b0[1];
    bVar2 = btVector3::cross(this_01,this_00);
    local_c8 = bVar2.m_floats._0_8_;
    local_68.m_floats[0] = local_c8[0];
    local_68.m_floats[1] = local_c8[1];
    local_c0 = bVar2.m_floats._8_8_;
    local_68.m_floats[2] = local_c0[0];
    local_68.m_floats[3] = local_c0[1];
    if (((*(byte *)(in_RDI + 0x5c4) & 1) != 0) && (in_stack_00000018 == 0)) {
      btVector3::operator*=(&local_58,(btScalar *)(in_RDI + 0x5bc));
      btVector3::operator*=(&local_68,(btScalar *)(in_RDI + 0x5c0));
    }
    for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
      pbVar1 = btVector3::operator_cast_to_float_(&local_58);
      *(btScalar *)(*(long *)(local_28 + 0x10) + (long)(local_2c + local_cc) * 4) = pbVar1[local_cc]
      ;
    }
    for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
      pbVar1 = btVector3::operator_cast_to_float_(&local_68);
      *(float *)(*(long *)(local_28 + 0x20) + (long)(local_2c + local_cc) * 4) = -pbVar1[local_cc];
    }
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateJacobi(btRotationalLimitMotor2 * limot, const btTransform& transA,const btTransform& transB, btConstraintInfo2 *info, int srow, btVector3& ax1, int rotational, int rotAllowed)
{
	btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
	btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;

	J1[srow+0] = ax1[0];
	J1[srow+1] = ax1[1];
	J1[srow+2] = ax1[2];

	J2[srow+0] = -ax1[0];
	J2[srow+1] = -ax1[1];
	J2[srow+2] = -ax1[2];

	if(!rotational)
	{
		btVector3 tmpA, tmpB, relA, relB;
		// get vector from bodyB to frameB in WCS
		relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
		// same for bodyA
		relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
		tmpA = relA.cross(ax1);
		tmpB = relB.cross(ax1);
		if(m_hasStaticBody && (!rotAllowed))
		{
			tmpA *= m_factA;
			tmpB *= m_factB;
		}
		int i;
		for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
	}
}